

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O1

void __thiscall AddressFilter::AddToList(AddressFilter *this,char *addrText)

{
  bool bVar1;
  int iVar2;
  size_t len;
  uint8_t *addr;
  in_addr ipv4_addr;
  in6_addr ipv6_addr;
  uint8_t local_34 [4];
  uint8_t local_30 [16];
  
  addr = local_34;
  iVar2 = inet_pton(2,addrText,addr);
  len = 4;
  bVar1 = true;
  if (iVar2 != 1) {
    addr = local_30;
    iVar2 = inet_pton(10,addrText,addr);
    if (iVar2 == 1) {
      len = 0x10;
    }
    else {
      addr = (uint8_t *)0x0;
      bVar1 = false;
      len = 0;
    }
  }
  if (bVar1) {
    AddToList(this,addr,len);
  }
  return;
}

Assistant:

void AddressFilter::AddToList(char const * addrText)
{
    uint8_t * addr_bin = NULL;
    size_t addr_len = 0;
    struct in_addr ipv4_addr;
    struct in6_addr ipv6_addr;

    if (inet_pton(AF_INET, addrText, &ipv4_addr) == 1)
    {
        /* Valid IPv4 address */
        addr_bin = (uint8_t *)&ipv4_addr;
        addr_len = sizeof(struct in_addr);
    }
    else  if (inet_pton(AF_INET6, addrText, &ipv6_addr) == 1)
    {
        /* Valid IPv6 address */
        addr_bin = (uint8_t *)&ipv6_addr;
        addr_len = sizeof(struct in6_addr);
    }

    if (addr_len > 0)
    {
        AddToList(addr_bin, addr_len);
    }
}